

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldDescriptorProto::SharedCtor(FieldDescriptorProto *this)

{
  string *psVar1;
  ArenaStringPtr *this_00;
  long in_RDI;
  SCCInfoBase *in_stack_ffffffffffffffd8;
  
  internal::InitSCC(in_stack_ffffffffffffffd8);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x18),psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x20),psVar1);
  this_00 = (ArenaStringPtr *)(in_RDI + 0x28);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(this_00,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x30),psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 0x38),psVar1);
  memset((void *)(in_RDI + 0x40),0,0x10);
  *(undefined4 *)(in_RDI + 0x50) = 1;
  *(undefined4 *)(in_RDI + 0x54) = 1;
  return;
}

Assistant:

void FieldDescriptorProto::SharedCtor() {
  ::PROTOBUF_NAMESPACE_ID::internal::InitSCC(&scc_info_FieldDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  extendee_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  type_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  default_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  json_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  ::memset(&options_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&oneof_index_) -
      reinterpret_cast<char*>(&options_)) + sizeof(oneof_index_));
  label_ = 1;
  type_ = 1;
}